

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O2

size_t restincurl::
       InDataHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::write_callback(char *ptr,size_t size,size_t nitems,void *userdata)

{
  size_t sVar1;
  
  if (userdata != (void *)0x0) {
    sVar1 = nitems * size;
    if (sVar1 != 0) {
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<char*,std::back_insert_iterator<std::__cxx11::string>>
                (ptr,ptr + sVar1,
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  ((long)userdata + 8));
    }
    return sVar1;
  }
  __assert_fail("userdata",
                "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                ,0x19b,
                "static size_t restincurl::InDataHandler<std::basic_string<char>>::write_callback(char *, size_t, size_t, void *) [T = std::basic_string<char>]"
               );
}

Assistant:

static size_t write_callback(char *ptr, size_t size, size_t nitems, void *userdata) {
            assert(userdata);
            auto self = reinterpret_cast<InDataHandler *>(userdata);
            const auto bytes = size * nitems;
            if (bytes > 0) {
                std::copy(ptr, ptr + bytes, std::back_inserter(self->data_));
            }
            return bytes;
        }